

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O2

void __thiscall QLayoutPrivate::QLayoutPrivate(QLayoutPrivate *this)

{
  QObjectPrivate::QObjectPrivate(&this->super_QObjectPrivate,QObjectPrivateVersion);
  *(undefined ***)this = &PTR__QObjectPrivate_007c0b60;
  this->insideSpacing = -1;
  this->userLeftMargin = -1;
  this->userTopMargin = -1;
  this->userRightMargin = -1;
  this->userBottomMargin = -1;
  this->field_0x8c = this->field_0x8c & 0xf0 | 6;
  this->constraint = SetDefaultConstraint;
  (this->rect).x1 = 0;
  (this->rect).y1 = 0;
  (this->rect).x2 = -1;
  (this->rect).y2.m_i = -1;
  this->menubar = (QWidget *)0x0;
  return;
}

Assistant:

QLayoutPrivate::QLayoutPrivate()
    : QObjectPrivate(), insideSpacing(-1), userLeftMargin(-1), userTopMargin(-1), userRightMargin(-1),
      userBottomMargin(-1), topLevel(false), enabled(true), activated(true), autoNewChild(false),
      constraint(QLayout::SetDefaultConstraint), menubar(nullptr)
{
}